

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  long lVar9;
  secp256k1_ge *psVar10;
  
  psVar10 = r;
  for (lVar9 = 0x15; lVar9 != 0; lVar9 = lVar9 + -1) {
    (psVar10->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((a->x).n + 1);
    psVar10 = (secp256k1_ge *)((psVar10->x).n + 1);
  }
  secp256k1_fe_normalize_weak(&r->y);
  uVar2 = (r->y).n[1];
  uVar3 = (r->y).n[2];
  uVar4 = (r->y).n[3];
  uVar5 = (r->y).n[4];
  uVar6 = (r->y).n[5];
  uVar7 = (r->y).n[6];
  uVar8 = (r->y).n[7];
  (r->y).n[0] = 0xffff0bc - (r->y).n[0];
  (r->y).n[1] = 0xffffefc - uVar2;
  (r->y).n[2] = 0xffffffc - uVar3;
  (r->y).n[3] = 0xffffffc - uVar4;
  (r->y).n[4] = 0xffffffc - uVar5;
  (r->y).n[5] = 0xffffffc - uVar6;
  (r->y).n[6] = 0xffffffc - uVar7;
  (r->y).n[7] = 0xffffffc - uVar8;
  uVar1 = *(undefined8 *)((r->y).n + 8);
  *(ulong *)((r->y).n + 8) = CONCAT44(0xfffffc - (int)((ulong)uVar1 >> 0x20),0xffffffc - (int)uVar1)
  ;
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
}